

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O1

int RankIsPlausible(pyhanabi_card_knowledge_t *knowledge,int rank)

{
  ulong uVar1;
  ulong uVar2;
  
  if (knowledge == (pyhanabi_card_knowledge_t *)0x0) {
    __assert_fail("knowledge != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,100,"int RankIsPlausible(pyhanabi_card_knowledge_t *, int)");
  }
  if (knowledge->knowledge != (void *)0x0) {
    uVar1 = (ulong)rank;
    uVar2 = uVar1 + 0x3f;
    if (-1 < (long)uVar1) {
      uVar2 = uVar1;
    }
    return (int)((*(ulong *)(((long)uVar2 >> 6) * 8 + *(long *)((long)knowledge->knowledge + 0x38) +
                             -8 + (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) * 8) >>
                  (uVar1 & 0x3f) & 1) != 0);
  }
  __assert_fail("knowledge->knowledge != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x65,"int RankIsPlausible(pyhanabi_card_knowledge_t *, int)");
}

Assistant:

int RankIsPlausible(pyhanabi_card_knowledge_t* knowledge, int rank) {
  REQUIRE(knowledge != nullptr);
  REQUIRE(knowledge->knowledge != nullptr);
  return reinterpret_cast<
             const hanabi_learning_env::HanabiHand::CardKnowledge*>(
             knowledge->knowledge)
      ->RankPlausible(rank);
}